

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall CHud::RenderHealthAndAmmo(CHud *this,CNetObj_Character *pCharacter)

{
  IGraphics *pIVar1;
  IClient *pIVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  float *pfVar15;
  long in_FS_OFFSET;
  CQuadItem Array [10];
  float local_d8;
  undefined8 local_d4;
  float local_cc [37];
  long local_38;
  
  pfVar9 = &local_d8;
  pfVar10 = &local_d8;
  pfVar7 = &local_d8;
  pfVar15 = &local_d8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pCharacter == (CNetObj_Character *)0x0) goto LAB_00146ae1;
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x13])
            (pIVar1,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0xb])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  if (pCharacter->m_Weapon == 5) {
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pClient;
    iVar8 = pCharacter->m_AmmoCount - pIVar2->m_CurGameTick;
    iVar6 = (pIVar2->m_GameTickSpeed * (g_pData->m_Weapons).m_Ninja.m_Duration) / 1000;
    iVar3 = iVar6;
    if (iVar8 < iVar6) {
      iVar3 = iVar8;
    }
    iVar5 = 0;
    if (-1 < iVar8) {
      iVar5 = iVar3;
    }
    RenderNinjaBar(this,5.0,29.0,(float)iVar5 / (float)iVar6);
  }
  else {
    uVar14 = 0;
    CRenderTools::SelectSprite
              (&((this->super_CComponent).m_pClient)->m_RenderTools,
               (g_pData->m_Weapons).m_aId[pCharacter->m_Weapon % 6].m_pSpriteProj,0,0,0);
    uVar13 = pCharacter->m_AmmoCount;
    uVar4 = 10;
    if ((int)uVar13 < 10) {
      uVar4 = uVar13;
    }
    if (pCharacter->m_Weapon == 3) {
      if (0 < (int)uVar13) {
        lVar11 = 0;
        do {
          *pfVar9 = (float)(int)lVar11 + 6.0;
          pfVar9[1] = 29.0;
          pfVar9[2] = 10.0;
          pfVar9[3] = 10.0;
          lVar11 = lVar11 + 0xc;
          pfVar9 = pfVar9 + 4;
        } while ((ulong)uVar4 * 0xc != lVar11);
LAB_0014684e:
        uVar14 = (ulong)uVar4;
      }
    }
    else if (0 < (int)uVar13) {
      lVar11 = 0;
      do {
        *pfVar10 = (float)(int)lVar11 + 5.0;
        pfVar10[1] = 29.0;
        pfVar10[2] = 12.0;
        pfVar10[3] = 12.0;
        lVar11 = lVar11 + 0xc;
        pfVar10 = pfVar10 + 4;
      } while ((ulong)uVar4 * 0xc != lVar11);
      goto LAB_0014684e;
    }
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_d8,uVar14);
  }
  uVar12 = 0;
  CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,10,0,0,0);
  uVar13 = pCharacter->m_Health;
  uVar4 = 10;
  if ((int)uVar13 < 10) {
    uVar4 = uVar13;
  }
  uVar14 = 0;
  if (0 < (int)uVar13) {
    lVar11 = 0;
    do {
      *pfVar7 = (float)(int)lVar11 + 5.0;
      pfVar7[1] = 5.0;
      pfVar7[2] = 12.0;
      pfVar7[3] = 12.0;
      lVar11 = lVar11 + 0xc;
      pfVar7 = pfVar7 + 4;
    } while ((ulong)uVar4 * 0xc != lVar11);
    uVar14 = (ulong)uVar4;
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  uVar13 = (uint)uVar14;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_d8,uVar14);
  CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xb,0,0,0);
  if (uVar13 < 10) {
    uVar12 = 10 - uVar13;
    iVar6 = uVar13 * 0xc;
    uVar14 = 0;
    do {
      *(float *)((long)&local_d8 + uVar14) = (float)iVar6 + 5.0;
      *(undefined8 *)((long)local_cc + (uVar14 - 8)) = 0x4140000040a00000;
      *(undefined4 *)((long)local_cc + uVar14) = 0x41400000;
      uVar14 = uVar14 + 0x10;
      iVar6 = iVar6 + 0xc;
    } while (uVar12 * 0x10 != uVar14);
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_d8,(ulong)uVar12);
  uVar12 = 0;
  CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xc,0,0,0);
  uVar13 = pCharacter->m_Armor;
  uVar4 = 10;
  if ((int)uVar13 < 10) {
    uVar4 = uVar13;
  }
  uVar14 = 0;
  if (0 < (int)uVar13) {
    lVar11 = 0;
    do {
      *pfVar15 = (float)(int)lVar11 + 5.0;
      pfVar15[1] = 17.0;
      pfVar15[2] = 12.0;
      pfVar15[3] = 12.0;
      lVar11 = lVar11 + 0xc;
      pfVar15 = pfVar15 + 4;
    } while ((ulong)uVar4 * 0xc != lVar11);
    uVar14 = (ulong)uVar4;
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  uVar13 = (uint)uVar14;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_d8,uVar14);
  CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xd,0,0,0);
  if (uVar13 < 10) {
    uVar12 = 10 - uVar13;
    iVar6 = uVar13 * 0xc;
    uVar14 = 0;
    do {
      *(float *)((long)&local_d8 + uVar14) = (float)iVar6 + 5.0;
      *(undefined8 *)((long)local_cc + (uVar14 - 8)) = 0x4140000041880000;
      *(undefined4 *)((long)local_cc + uVar14) = 0x41400000;
      uVar14 = uVar14 + 0x10;
      iVar6 = iVar6 + 0xc;
    } while (uVar12 * 0x10 != uVar14);
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_d8,(ulong)uVar12);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[10])();
LAB_00146ae1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderHealthAndAmmo(const CNetObj_Character *pCharacter)
{
	if(!pCharacter)
		return;

	float x = 5;
	float y = 5;
	int i;
	IGraphics::CQuadItem Array[10];

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->WrapClamp();

	Graphics()->QuadsBegin();
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);

	// render ammo
	if(pCharacter->m_Weapon == WEAPON_NINJA)
	{
		const int Max = g_pData->m_Weapons.m_Ninja.m_Duration * Client()->GameTickSpeed() / 1000;
		float NinjaProgress = clamp(pCharacter->m_AmmoCount-Client()->GameTick(), 0, Max) / (float)Max;
		RenderNinjaBar(x, y+24.f, NinjaProgress);
	}
	else
	{
		RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[pCharacter->m_Weapon%NUM_WEAPONS].m_pSpriteProj);
		if(pCharacter->m_Weapon == WEAPON_GRENADE)
		{
			for(i = 0; i < minimum(pCharacter->m_AmmoCount, 10); i++)
				Array[i] = IGraphics::CQuadItem(x+1+i*12, y+24, 10, 10);
		}
		else
		{
			for(i = 0; i < minimum(pCharacter->m_AmmoCount, 10); i++)
				Array[i] = IGraphics::CQuadItem(x+i*12, y+24, 12, 12);
		}
		Graphics()->QuadsDrawTL(Array, i);
	}

	int h = 0;

	// render health
	RenderTools()->SelectSprite(SPRITE_HEALTH_FULL);
	for(; h < minimum(pCharacter->m_Health, 10); h++)
		Array[h] = IGraphics::CQuadItem(x+h*12,y,12,12);
	Graphics()->QuadsDrawTL(Array, h);

	i = 0;
	RenderTools()->SelectSprite(SPRITE_HEALTH_EMPTY);
	for(; h < 10; h++)
		Array[i++] = IGraphics::CQuadItem(x+h*12,y,12,12);
	Graphics()->QuadsDrawTL(Array, i);

	// render armor meter
	h = 0;
	RenderTools()->SelectSprite(SPRITE_ARMOR_FULL);
	for(; h < minimum(pCharacter->m_Armor, 10); h++)
		Array[h] = IGraphics::CQuadItem(x+h*12,y+12,12,12);
	Graphics()->QuadsDrawTL(Array, h);

	i = 0;
	RenderTools()->SelectSprite(SPRITE_ARMOR_EMPTY);
	for(; h < 10; h++)
		Array[i++] = IGraphics::CQuadItem(x+h*12,y+12,12,12);
	Graphics()->QuadsDrawTL(Array, i);
	Graphics()->QuadsEnd();
	Graphics()->WrapNormal();
}